

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewSymbolTreeVisitor.cpp
# Opt level: O0

void __thiscall
NewSymbolTreeVisitor::Visit(NewSymbolTreeVisitor *this,MethodInvocation *method_invocation)

{
  bool bVar1;
  mapped_type *pmVar2;
  __tuple_element_t<1UL,_tuple<unordered_map<Symbol,_pair<basic_string<char>,_shared_ptr<PrimitiveObject>_>,_hash<Symbol>,_equal_to<Symbol>,_allocator<pair<const_Symbol,_pair<basic_string<char>,_shared_ptr<PrimitiveObject>_>_>_>_>,_unordered_map<Symbol,_shared_ptr<Method>,_hash<Symbol>,_equal_to<Symbol>,_allocator<pair<const_Symbol,_shared_ptr<Method>_>_>_>,_unordered_map<Symbol,_pair<basic_string<char>,_shared_ptr<PrimitiveObject>_>,_hash<Symbol>,_equal_to<Symbol>,_allocator<pair<const_Symbol,_pair<basic_string<char>,_shared_ptr<PrimitiveObject>_>_>_>_>_>_>
  *p_Var3;
  runtime_error *this_00;
  _Node_iterator_base<std::pair<const_Symbol,_std::shared_ptr<Method>_>,_true> local_120;
  string local_118;
  Symbol local_f8;
  _Node_iterator_base<std::pair<const_Symbol,_std::shared_ptr<Method>_>,_true> local_d8;
  string local_d0;
  Symbol local_b0;
  string local_90;
  Symbol local_70;
  Symbol *local_50;
  Symbol *symbol;
  undefined1 local_38 [8];
  Symbol class_name;
  MethodInvocation *method_invocation_local;
  NewSymbolTreeVisitor *this_local;
  
  class_name.name_.field_2._8_8_ = method_invocation;
  Symbol::Symbol((Symbol *)local_38);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (class_name.name_.field_2._8_8_ + 0x10),"this");
  if (bVar1) {
    Symbol::operator=((Symbol *)local_38,&this->current_layer_->class_symbol_);
  }
  else {
    std::__cxx11::string::string
              ((string *)&local_90,(string *)(class_name.name_.field_2._8_8_ + 0x10));
    Symbol::Symbol(&local_70,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    local_50 = &local_70;
    NewScopeLayer::GetVariableLayer(this->current_layer_,local_50);
    UserTypeResolving_abi_cxx11_(&local_d0,this,local_50);
    Symbol::Symbol(&local_b0,&local_d0);
    Symbol::operator=((Symbol *)local_38,&local_b0);
    Symbol::~Symbol(&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    Symbol::~Symbol(&local_70);
  }
  pmVar2 = std::
           unordered_map<Symbol,_std::tuple<std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>,_std::unordered_map<Symbol,_std::shared_ptr<Method>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Method>_>_>_>,_std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::tuple<std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>,_std::unordered_map<Symbol,_std::shared_ptr<Method>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Method>_>_>_>,_std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>_>_>_>_>
           ::operator[](&(this->tree_).class_symbols_table_,(key_type *)local_38);
  p_Var3 = std::
           get<1ul,std::unordered_map<Symbol,std::pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>>,std::hash<Symbol>,std::equal_to<Symbol>,std::allocator<std::pair<Symbol_const,std::pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>>>>>,std::unordered_map<Symbol,std::shared_ptr<Method>,std::hash<Symbol>,std::equal_to<Symbol>,std::allocator<std::pair<Symbol_const,std::shared_ptr<Method>>>>,std::unordered_map<Symbol,std::pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>>,std::hash<Symbol>,std::equal_to<Symbol>,std::allocator<std::pair<Symbol_const,std::pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>>>>>>
                     (pmVar2);
  std::__cxx11::string::string
            ((string *)&local_118,(string *)(class_name.name_.field_2._8_8_ + 0x30));
  Symbol::Symbol(&local_f8,&local_118);
  local_d8._M_cur =
       (__node_type *)
       std::
       unordered_map<Symbol,_std::shared_ptr<Method>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Method>_>_>_>
       ::find(p_Var3,&local_f8);
  pmVar2 = std::
           unordered_map<Symbol,_std::tuple<std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>,_std::unordered_map<Symbol,_std::shared_ptr<Method>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Method>_>_>_>,_std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::tuple<std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>,_std::unordered_map<Symbol,_std::shared_ptr<Method>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Method>_>_>_>,_std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>_>_>_>_>
           ::operator[](&(this->tree_).class_symbols_table_,(key_type *)local_38);
  p_Var3 = std::
           get<1ul,std::unordered_map<Symbol,std::pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>>,std::hash<Symbol>,std::equal_to<Symbol>,std::allocator<std::pair<Symbol_const,std::pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>>>>>,std::unordered_map<Symbol,std::shared_ptr<Method>,std::hash<Symbol>,std::equal_to<Symbol>,std::allocator<std::pair<Symbol_const,std::shared_ptr<Method>>>>,std::unordered_map<Symbol,std::pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>>,std::hash<Symbol>,std::equal_to<Symbol>,std::allocator<std::pair<Symbol_const,std::pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>>>>>>
                     (pmVar2);
  local_120._M_cur =
       (__node_type *)
       std::
       unordered_map<Symbol,_std::shared_ptr<Method>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Method>_>_>_>
       ::end(p_Var3);
  bVar1 = std::__detail::operator==(&local_d8,&local_120);
  Symbol::~Symbol(&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  if (!bVar1) {
    if (*(long *)(class_name.name_.field_2._8_8_ + 0x50) != 0) {
      (**(code **)**(undefined8 **)(class_name.name_.field_2._8_8_ + 0x50))
                (*(undefined8 **)(class_name.name_.field_2._8_8_ + 0x50),this);
    }
    Symbol::~Symbol((Symbol *)local_38);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Can\'t find method name");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void NewSymbolTreeVisitor::Visit(MethodInvocation* method_invocation) {
  Symbol class_name;
  if (method_invocation->call_from_ == "this") {
    class_name = current_layer_->class_symbol_;
  } else {
    const Symbol& symbol = Symbol(method_invocation->call_from_);

    current_layer_->GetVariableLayer(symbol);

    class_name = Symbol(UserTypeResolving(symbol));
  }

  if (std::get<1>(tree_.class_symbols_table_[class_name])
          .find(Symbol(method_invocation->method_name_)) ==
      std::get<1>(tree_.class_symbols_table_[class_name]).end()) {
    throw std::runtime_error("Can't find method name");
  }

  if (method_invocation->arguments_list_) {
    method_invocation->arguments_list_->Accept(this);
  }
}